

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<char,_std::char_traits<char>_> *stream,uint options,xml_encoding encoding)

{
  xml_document_struct *doc;
  undefined *puVar1;
  uint uVar2;
  xml_encoding encoding_00;
  long lVar3;
  long lVar4;
  void *contents;
  undefined8 *puVar5;
  ulong uVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong size;
  undefined8 *puVar10;
  void *__dest;
  bool bVar11;
  undefined1 auVar12 [16];
  xml_parse_status local_54;
  
  _destroy(this);
  _create(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    goto LAB_00121455;
  }
  doc = (xml_document_struct *)(this->super_xml_node)._root;
  lVar3 = std::istream::tellg();
  if (lVar3 < 0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    uVar2 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
    puVar7 = (undefined8 *)0x0;
    size = 0;
    puVar10 = (undefined8 *)0x0;
LAB_00121263:
    if ((uVar2 & 2) == 0) {
      puVar5 = (undefined8 *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(0x7fe8);
      local_54 = status_out_of_memory;
      if (puVar5 == (undefined8 *)0x0) {
LAB_001213c9:
        local_54 = status_out_of_memory;
        size = 0;
        contents = (void *)0x0;
        bVar11 = false;
      }
      else {
        *puVar5 = 0;
        puVar5[1] = 0;
        puVar8 = puVar5;
        if (puVar7 != (undefined8 *)0x0) {
          *puVar7 = puVar5;
          puVar8 = puVar10;
        }
        std::istream::read((char *)stream,(long)(puVar5 + 2));
        uVar9 = *(ulong *)(stream + 8);
        puVar5[1] = uVar9;
        uVar2 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
        contents = (void *)0x0;
        puVar10 = puVar8;
        if (((uVar2 & 1) == 0) && ((uVar2 & 6) != 4)) goto code_r0x001212e7;
        size = 0;
        bVar11 = false;
        local_54 = status_io_error;
      }
    }
    else {
      contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                   xml_memory_management_function_storage<int>::allocate)(size + 1);
      if (contents == (void *)0x0) goto LAB_001213c9;
      __dest = contents;
      if (puVar10 != (undefined8 *)0x0) {
        puVar7 = puVar10;
        do {
          if ((long)contents + size < (ulong)((long)__dest + puVar7[1])) {
            __assert_fail("write + chunk->size <= buffer + total",
                          "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                          ,0x1316,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                         );
          }
          memcpy(__dest,puVar7 + 2,puVar7[1]);
          __dest = (void *)((long)__dest + puVar7[1]);
          puVar7 = (undefined8 *)*puVar7;
        } while (puVar7 != (undefined8 *)0x0);
      }
      if (__dest != (void *)((long)contents + size)) {
        __assert_fail("write == buffer + total",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x131b,
                      "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                     );
      }
      local_54 = status_ok;
      bVar11 = true;
    }
    goto LAB_001213d1;
  }
  auVar12 = std::istream::tellg();
  lVar3 = auVar12._0_8_;
  local_54 = status_io_error;
  std::istream::seekg((long)stream,_S_beg);
  lVar4 = std::istream::tellg();
  std::istream::seekg(stream,lVar3,auVar12._8_8_);
  if (-1 < lVar3 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    uVar9 = lVar4 - lVar3;
    local_54 = status_out_of_memory;
    if ((-1 < (long)uVar9) &&
       (contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                     xml_memory_management_function_storage<int>::allocate)
                                     (uVar9 + 1),
       puVar1 = impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
       , contents != (void *)0x0)) {
      std::istream::read((char *)stream,(long)contents);
      if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) != 4 &&
          (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) == 0) {
        size = *(ulong *)(stream + 8);
        if (uVar9 < size) {
          __assert_fail("actual_length <= read_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                        ,0x1340,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                       );
        }
        goto LAB_001213ee;
      }
      (*(code *)puVar1)(contents);
      local_54 = status_io_error;
    }
  }
  goto LAB_00121445;
code_r0x001212e7:
  uVar6 = uVar9 + size;
  if (uVar9 + size <= size) {
    uVar6 = size;
  }
  bVar11 = CARRY8(uVar9,size);
  puVar7 = puVar5;
  size = uVar6;
  if (bVar11) goto code_r0x00121304;
  goto LAB_00121263;
code_r0x00121304:
  size = 0;
  contents = (void *)0x0;
  bVar11 = false;
LAB_001213d1:
  while (puVar10 != (undefined8 *)0x0) {
    puVar7 = (undefined8 *)*puVar10;
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (puVar10);
    puVar10 = puVar7;
  }
  if (bVar11) {
LAB_001213ee:
    encoding_00 = impl::anon_unknown_0::get_buffer_encoding(encoding,contents,size);
    if (encoding_00 == encoding_utf8) {
      *(undefined1 *)((long)contents + size) = 0;
      size = size + 1;
    }
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,doc,(xml_node_struct *)doc,contents,size,options,encoding_00,
               true,true,&this->_buffer);
    return __return_storage_ptr__;
  }
LAB_00121445:
  xml_parse_result::xml_parse_result(__return_storage_ptr__);
  __return_storage_ptr__->status = local_54;
LAB_00121455:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_document::load(std::basic_istream<char, std::char_traits<char> >& stream, unsigned int options, xml_encoding encoding)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding, &_buffer);
	}